

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O0

void __thiscall
cppjieba::Trie::Find
          (Trie *this,const_iterator begin,const_iterator end,
          vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *res,size_t max_word_len)

{
  undefined8 uVar1;
  bool bVar2;
  undefined8 *puVar3;
  reference pvVar4;
  pointer pvVar5;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  ulong in_R8;
  bool bVar6;
  size_t j;
  size_t i;
  const_iterator citer;
  TrieNode *ptNode;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  size_type in_stack_ffffffffffffff28;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *in_stack_ffffffffffffff30;
  bool local_c1;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> local_b0;
  _Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false> local_a0;
  _Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false> local_98;
  __node_type *local_90;
  ulong local_88;
  DictUnit *local_80;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> local_78;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> local_68;
  _Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false> local_58;
  __node_type *local_50;
  _Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false> local_48;
  unsigned_long local_40;
  _Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false> local_38;
  TrieNode *local_30;
  ulong local_28;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *local_20;
  long local_18;
  long local_10;
  
  if (*in_RDI == 0) {
    __assert_fail("root_ != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/Trie.hpp"
                  ,0x55,
                  "void cppjieba::Trie::Find(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<struct Dag> &, size_t) const"
                 );
  }
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::resize
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_30 = (TrieNode *)0x0;
  std::__detail::
  _Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
              *)0x1a6989);
  local_40 = 0;
  do {
    if ((ulong)((local_18 - local_10) / 0x14) <= local_40) {
      return;
    }
    puVar3 = (undefined8 *)(local_10 + local_40 * 0x14);
    pvVar4 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[]
                       (local_20,local_40);
    uVar1 = *puVar3;
    (pvVar4->runestr).rune = (int)uVar1;
    (pvVar4->runestr).offset = (int)((ulong)uVar1 >> 0x20);
    uVar1 = puVar3[1];
    (pvVar4->runestr).len = (int)uVar1;
    (pvVar4->runestr).unicode_offset = (int)((ulong)uVar1 >> 0x20);
    (pvVar4->runestr).unicode_length = *(uint32_t *)(puVar3 + 2);
    local_c1 = false;
    if (*(long *)*in_RDI != 0) {
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
           ::end((unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
                  *)in_stack_ffffffffffffff08);
      std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[](local_20,local_40);
      local_58._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
           ::find((unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
                   *)in_stack_ffffffffffffff08,(key_type *)0x1a6a7f);
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>::
      _Node_const_iterator
                ((_Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                  *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                 (_Node_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                  *)in_stack_ffffffffffffff08);
      local_38._M_cur = local_50;
      local_c1 = std::__detail::operator!=(&local_48,&local_38);
    }
    if (local_c1 == false) {
      local_30 = (TrieNode *)0x0;
    }
    else {
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                             *)0x1a6adc);
      local_30 = pvVar5->second;
    }
    if (local_30 == (TrieNode *)0x0) {
      std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[](local_20,local_40);
      local_80 = (DictUnit *)0x0;
      std::pair<unsigned_long,_const_cppjieba::DictUnit_*>::
      pair<unsigned_long_&,_const_cppjieba::DictUnit_*,_true>(&local_78,&local_40,&local_80);
      limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::push_back
                ((LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *)
                 CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08);
      local_88 = local_40;
    }
    else {
      std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[](local_20,local_40);
      std::pair<unsigned_long,_const_cppjieba::DictUnit_*>::pair<unsigned_long_&,_true>
                (&local_68,&local_40,&local_30->ptValue);
      limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::push_back
                ((LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *)
                 CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08);
      local_88 = local_40;
    }
    while( true ) {
      local_88 = local_88 + 1;
      bVar6 = local_88 < (ulong)((local_18 - local_10) / 0x14);
      bVar2 = (local_88 - local_40) + 1 <= local_28;
      in_stack_ffffffffffffff17 = bVar6 && bVar2;
      if (((!bVar6 || !bVar2) || (local_30 == (TrieNode *)0x0)) ||
         (local_30->next == (NextMap *)0x0)) break;
      local_98._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
           ::find((unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
                   *)in_stack_ffffffffffffff08,(key_type *)0x1a6c54);
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>::
      _Node_const_iterator
                ((_Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                  *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                 (_Node_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                  *)in_stack_ffffffffffffff08);
      local_38._M_cur = local_90;
      local_a0._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
           ::end((unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
                  *)in_stack_ffffffffffffff08);
      bVar2 = std::__detail::operator==(&local_a0,&local_38);
      if (bVar2) break;
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                             *)0x1a6cb4);
      local_30 = pvVar5->second;
      if (local_30->ptValue != (DictUnit *)0x0) {
        pvVar4 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[]
                           (local_20,local_40);
        in_stack_ffffffffffffff08 = (pvVar4->nexts).buffer_;
        std::pair<unsigned_long,_const_cppjieba::DictUnit_*>::pair<unsigned_long_&,_true>
                  (&local_b0,&local_88,&local_30->ptValue);
        limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::push_back
                  ((LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *)
                   CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff08);
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void Find(RuneStrArray::const_iterator begin, 
        RuneStrArray::const_iterator end, 
        vector<struct Dag>&res, 
        size_t max_word_len = MAX_WORD_LENGTH) const {
    assert(root_ != NULL);
    res.resize(end - begin);

    const TrieNode *ptNode = NULL;
    TrieNode::NextMap::const_iterator citer;
    for (size_t i = 0; i < size_t(end - begin); i++) {
      res[i].runestr = *(begin + i);

      if (root_->next != NULL && root_->next->end() != (citer = root_->next->find(res[i].runestr.rune))) {
        ptNode = citer->second;
      } else {
        ptNode = NULL;
      }
      if (ptNode != NULL) {
        res[i].nexts.push_back(pair<size_t, const DictUnit*>(i, ptNode->ptValue));
      } else {
        res[i].nexts.push_back(pair<size_t, const DictUnit*>(i, static_cast<const DictUnit*>(NULL)));
      }

      for (size_t j = i + 1; j < size_t(end - begin) && (j - i + 1) <= max_word_len; j++) {
        if (ptNode == NULL || ptNode->next == NULL) {
          break;
        }
        citer = ptNode->next->find((begin + j)->rune);
        if (ptNode->next->end() == citer) {
          break;
        }
        ptNode = citer->second;
        if (NULL != ptNode->ptValue) {
          res[i].nexts.push_back(pair<size_t, const DictUnit*>(j, ptNode->ptValue));
        }
      }
    }
  }